

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O3

void __thiscall chrono::fea::ChLinkPointTriface::ConstraintsLoadJacobians(ChLinkPointTriface *this)

{
  ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1> *pCVar1;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *pCVar2;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *pCVar3;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars3> *pCVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar52;
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ChMatrix33<double> Jxa;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  double local_188;
  double local_180;
  double local_178;
  undefined8 uStack_170;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  undefined8 uStack_150;
  double dStack_148;
  double dStack_140;
  undefined1 local_138 [16];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  undefined8 uStack_20;
  
  auVar27 = in_ZMM9._0_16_;
  local_120 = 0x3ff0000000000000;
  local_108 = 0;
  dVar31 = (1.0 - this->s2) - this->s3;
  local_118 = 0;
  uStack_110 = 0;
  local_100 = 0x3ff0000000000000;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_e0 = 0x3ff0000000000000;
  if ((this->d != 0.0) || (NAN(this->d))) {
    peVar5 = (this->mtriangle).mnodeB1.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar6 = (this->mtriangle).mnodeB2.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar7 = (this->mtriangle).mnodeB3.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uStack_20 = 0;
    auVar23 = *(undefined1 (*) [16])&peVar5->field_0x28;
    auVar33._0_8_ = *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(double *)&peVar6->field_0x30;
    dVar10 = auVar33._0_8_ - *(double *)&(peVar7->super_ChNodeFEAbase).field_0x20;
    local_88 = vsubpd_avx(auVar23,*(undefined1 (*) [16])&peVar7->field_0x28);
    dVar11 = auVar23._0_8_ - *(double *)&peVar6->field_0x28;
    auVar30._8_8_ = auVar23._8_8_;
    auVar30._0_8_ = auVar33._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)&(peVar6->super_ChNodeFEAbase).field_0x20;
    local_138._8_8_ = 0;
    local_138._0_8_ = dVar10;
    auVar23 = vunpcklpd_avx(local_138,local_88);
    local_68._8_8_ = 0;
    local_68._0_8_ = dVar11;
    auVar26 = vunpcklpd_avx(auVar25,auVar21);
    local_58 = vsubpd_avx(auVar30,auVar26);
    local_78 = vshufpd_avx(local_88,local_88,1);
    local_48 = vshufpd_avx(local_58,local_58,1);
    auVar33._0_8_ = local_58._0_8_ * local_78._0_8_ - dVar10 * local_48._0_8_;
    auVar20._8_8_ = 0x7fffffffffffffff;
    auVar20._0_8_ = 0x7fffffffffffffff;
    local_d8._8_8_ = 0;
    local_d8._0_8_ = auVar33._0_8_;
    local_98 = vandpd_avx(local_d8,auVar20);
    auVar26 = vunpcklpd_avx(local_58,local_68);
    auVar36._0_8_ = auVar26._0_8_ * local_88._0_8_;
    auVar36._8_8_ = auVar26._8_8_ * local_88._8_8_;
    auVar37._0_8_ = auVar23._0_8_ * dVar11;
    auVar37._8_8_ = auVar23._8_8_ * local_58._8_8_;
    local_c8 = vsubpd_avx(auVar36,auVar37);
    local_a8 = vandpd_avx(local_c8,auVar20);
    local_b8 = *(double *)&peVar6->field_0x30 - *(double *)&peVar7->field_0x30;
    uStack_b0 = 0;
    local_38 = vshufpd_avx(local_c8,local_c8,1);
    local_188 = local_38._0_8_ * local_38._0_8_ +
                local_c8._0_8_ * local_c8._0_8_ + auVar33._0_8_ * auVar33._0_8_;
    local_28 = dVar31;
    dVar31 = pow(local_188,1.5);
    peVar5 = (this->mtriangle).mnodeB2.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar6 = (this->mtriangle).mnodeB3.
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar28._8_8_ = uStack_b0;
    auVar28._0_8_ = local_b8;
    auVar16._8_8_ = uStack_20;
    auVar16._0_8_ = local_28;
    dVar12 = *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20 -
             *(double *)&(peVar6->super_ChNodeFEAbase).field_0x20;
    auVar42._0_8_ = 1.0 / dVar31;
    auVar42._8_8_ = 0;
    auVar30 = vucomisd_avx512f(ZEXT816(0) << 0x40);
    auVar20 = vmulsd_avx512f(local_78,local_98);
    auVar21 = vmulsd_avx512f(local_58,local_98);
    auVar22 = vmulsd_avx512f(local_48,local_98);
    dVar13 = *(double *)&peVar5->field_0x28 - *(double *)&peVar6->field_0x28;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_188;
    auVar26 = vsqrtsd_avx(auVar27,auVar23);
    vucomisd_avx512f(auVar30);
    uVar18 = vcmppd_avx512vl(ZEXT816(0),local_c8,1);
    uVar15 = vcmppd_avx512vl(local_c8,ZEXT816(0),1);
    auVar23 = vpmovm2b_avx512vl(uVar15 & 3);
    auVar29 = vpmovm2b_avx512vl(uVar18 & 3);
    auVar23 = vpsubb_avx(auVar23,auVar29);
    auVar23 = vpmovsxbd_avx(auVar23);
    auVar23 = vcvtdq2pd_avx512vl(auVar23);
    dVar31 = this->d;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar31;
    auVar24 = vmulsd_avx512f(auVar28,auVar34);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar13;
    auVar25 = vmulsd_avx512f(auVar49,auVar34);
    auVar32._0_8_ = 1.0 / auVar26._0_8_;
    auVar32._8_8_ = 0;
    auVar26 = vmulsd_avx512f(local_88,local_a8);
    auVar26 = vmulsd_avx512f(auVar26,auVar23);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auVar27._8_8_;
    auVar27 = vmulsd_avx512f(auVar28,local_98);
    auVar33._0_8_ = auVar20._0_8_ * 0.0;
    dVar8 = auVar27._0_8_ * 0.0;
    dVar10 = auVar21._0_8_ * 0.0;
    dVar9 = auVar22._0_8_ * 0.0;
    auVar20 = vshufpd_avx512vl(auVar23,auVar23,1);
    auVar33._0_8_ = auVar26._0_8_ + auVar26._0_8_ + auVar33._0_8_ + auVar33._0_8_;
    auVar27 = vshufps_avx(local_a8,local_a8,0x4e);
    auVar26 = vmulsd_avx512f(local_78,auVar27);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_138._0_8_ * local_a8._0_8_;
    auVar21 = vmulsd_avx512f(auVar38,auVar23);
    dVar48 = auVar20._0_8_;
    dVar11 = auVar26._0_8_ * dVar48;
    dVar14 = (auVar21._0_8_ + auVar21._0_8_) - (dVar11 + dVar11);
    auVar26 = vmulsd_avx512f(local_138,local_98);
    auVar20 = vmulsd_avx512f(local_88,auVar27);
    auVar27 = vmulsd_avx512f(local_68,auVar27);
    auVar28 = vunpcklpd_avx512vl(auVar28,local_98);
    dVar11 = auVar20._0_8_ * dVar48;
    dVar48 = auVar27._0_8_ * dVar48;
    dVar52 = auVar26._0_8_ * 0.0;
    auVar27 = vshufpd_avx512vl(local_a8,auVar29 << 0x40,1);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auVar32._0_8_ * dVar31;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar12;
    auVar29 = vmulsd_avx512f(auVar63,auVar40);
    auVar41._8_8_ = 0x8000000000000000;
    auVar41._0_8_ = 0x8000000000000000;
    dVar10 = dVar10 + dVar10 + dVar48 + dVar48;
    auVar26 = vunpcklpd_avx512vl(auVar23,auVar49);
    dVar11 = dVar11 + dVar11 + dVar52 + dVar52;
    auVar20 = vmulsd_avx512f(local_68,local_a8);
    auVar26 = vmulpd_avx512vl(local_a8,auVar26);
    auVar20 = vmulsd_avx512f(auVar20,auVar23);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar13;
    auVar21 = vmulsd_avx512f(auVar26,auVar50);
    auVar27 = vmulpd_avx512vl(auVar28,auVar27);
    auVar28 = vshufpd_avx512vl(auVar23,auVar63,1);
    auVar22._8_8_ = auVar23._8_8_;
    auVar22._0_8_ = dVar12;
    auVar26 = vmulpd_avx512vl(auVar26,auVar22);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auVar32._0_8_ * auVar24._0_8_;
    auVar22 = vxorpd_avx512vl(auVar60,auVar41);
    dVar48 = auVar28._0_8_ * auVar27._0_8_;
    dVar52 = auVar28._8_8_ * auVar27._8_8_;
    auVar64._0_8_ = auVar26._0_8_ + auVar26._0_8_;
    auVar64._8_8_ = auVar26._8_8_ + auVar26._8_8_;
    dVar9 = dVar9 + dVar9 + auVar20._0_8_ + auVar20._0_8_;
    auVar27 = vmulpd_avx512vl(local_58,local_a8);
    auVar28 = vxorpd_avx512vl(auVar34,auVar41);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar8 + dVar8;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auVar21._0_8_ + auVar21._0_8_;
    auVar20 = vaddsd_avx512f(auVar67,auVar54);
    auVar51._0_8_ = dVar48 + dVar48;
    auVar51._8_8_ = dVar52 + dVar52;
    auVar26 = vmulsd_avx512f(auVar30,auVar28);
    auVar23 = vmulpd_avx512vl(auVar27,auVar23);
    auVar27 = vsubpd_avx512vl(auVar64,auVar51);
    auVar65._0_8_ = auVar64._0_8_ + auVar51._0_8_;
    auVar65._8_8_ = auVar64._8_8_ + auVar51._8_8_;
    auVar36 = ZEXT816(0x3fe0000000000000);
    dVar8 = auVar26._0_8_ * auVar42._0_8_;
    auVar26 = vmulsd_avx512f(local_38,auVar28);
    dVar48 = local_38._0_8_ * dVar31 * auVar42._0_8_;
    dVar31 = auVar26._0_8_ * auVar42._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar48;
    auVar26 = vmulsd_avx512f(auVar20,auVar55);
    auVar26 = vmulsd_avx512f(auVar26,auVar36);
    auVar26 = vsubsd_avx512f(auVar26,auVar16);
    vmovsd_avx512f(auVar26);
    auVar26 = vmulsd_avx512f(auVar55,auVar27);
    auVar26 = vmulsd_avx512f(auVar26,auVar36);
    auVar26 = vsubsd_avx512f(auVar22,auVar26);
    vmovsd_avx512f(auVar26);
    auVar21 = vshufpd_avx512vl(auVar65,auVar65,1);
    auVar24._0_8_ = auVar27._0_8_;
    auVar24._8_8_ = auVar65._8_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar31;
    auVar26 = vmulsd_avx512f(auVar68,auVar21);
    auVar26 = vmulsd_avx512f(auVar26,auVar36);
    auVar26 = vfmadd231sd_avx512f(auVar26,auVar25,auVar32);
    vmovsd_avx512f(auVar26);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar8;
    auVar26 = vmulsd_avx512f(auVar20,auVar58);
    auVar26 = vmulsd_avx512f(auVar26,auVar36);
    auVar26 = vaddsd_avx512f(auVar60,auVar26);
    auVar30 = vmulsd_avx512f(auVar30,auVar34);
    dVar52 = auVar30._0_8_ * auVar42._0_8_;
    vmovsd_avx512f(auVar26);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar52;
    auVar26 = vmovddup_avx512vl(auVar61);
    auVar30 = vmulpd_avx512vl(auVar26,auVar24);
    auVar26._8_8_ = 0x3fe0000000000000;
    auVar26._0_8_ = 0x3fe0000000000000;
    auVar26 = vmulpd_avx512vl(auVar30,auVar26);
    auVar30 = vunpcklpd_avx512vl(auVar16,auVar29);
    auVar26 = vsubpd_avx512vl(auVar26,auVar30);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar14;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar48;
    auVar30 = vmulsd_avx512f(auVar53,auVar56);
    uStack_1b0 = auVar26._0_8_;
    uStack_1a8 = auVar26._8_8_;
    auVar26 = vmulsd_avx512f(local_c8,auVar34);
    auVar30 = vmulsd_avx512f(auVar30,auVar36);
    dVar12 = auVar26._0_8_ * auVar42._0_8_;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar12;
    auVar26 = vmulsd_avx512f(auVar20,auVar66);
    auVar26 = vmulsd_avx512f(auVar26,auVar36);
    auVar26 = vfnmadd231sd_avx512f(auVar26,auVar32,auVar25);
    vmovsd_avx512f(auVar26);
    auVar26 = vmulsd_avx512f(local_c8,auVar28);
    auVar28 = vmulsd_avx512f(auVar42,auVar26);
    auVar26 = vxorpd_avx512vl(auVar16,auVar41);
    auVar27 = vmulsd_avx512f(auVar28,auVar27);
    auVar27 = vmulsd_avx512f(auVar27,auVar36);
    auVar27 = vaddsd_avx512f(auVar29,auVar27);
    auVar29 = vmulsd_avx512f(local_88,auVar34);
    vmovsd_avx512f(auVar27);
    auVar27 = vmulsd_avx512f(auVar66,auVar21);
    auVar29 = vmulsd_avx512f(auVar32,auVar29);
    auVar27 = vmulsd_avx512f(auVar27,auVar36);
    auVar27 = vsubsd_avx512f(auVar26,auVar27);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auVar33._0_8_;
    auVar26 = vmulsd_avx512f(auVar43,auVar56);
    vmovsd_avx512f(auVar27);
    auVar27 = vmulsd_avx512f(auVar26,auVar36);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = this->s2;
    auVar26 = vxorpd_avx512vl(auVar70,auVar41);
    auVar27 = vsubsd_avx512f(auVar26,auVar27);
    vmovsd_avx512f(auVar27);
    auVar27 = vmulsd_avx512f(local_78,auVar34);
    auVar30 = vfmadd231sd_avx512f(auVar30,auVar27,auVar32);
    vmovsd_avx512f(auVar30);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar11;
    auVar30 = vmulsd_avx512f(auVar57,auVar56);
    auVar30 = vmulsd_avx512f(auVar30,auVar36);
    auVar30 = vsubsd_avx512f(auVar30,auVar29);
    vmovsd_avx512f(auVar30);
    auVar30 = vmulsd_avx512f(auVar43,auVar61);
    auVar30 = vmulsd_avx512f(auVar30,auVar36);
    auVar27 = vfnmadd231sd_avx512f(auVar30,auVar32,auVar27);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar52;
    auVar30 = vmulsd_avx512f(auVar53,auVar62);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar33._0_8_ * auVar28._0_8_ * 0.5;
    auVar29 = vaddsd_avx512f(auVar29,auVar44);
    auVar30 = vmulsd_avx512f(auVar30,auVar36);
    vmovsd_avx512f(auVar27);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_138._0_8_;
    auVar27 = vmulsd_avx512f(auVar34,auVar27);
    auVar26 = vsubsd_avx512f(auVar26,auVar30);
    vmovsd_avx512f(auVar26);
    auVar26 = vmulsd_avx512f(auVar57,auVar58);
    auVar26 = vmulsd_avx512f(auVar26,auVar36);
    auVar26 = vfmadd231sd_avx512f(auVar26,auVar27,auVar32);
    vmovsd_avx512f(auVar26);
    local_1e8 = auVar29._0_8_;
    auVar26 = vmulsd_avx512f(local_48,auVar34);
    dStack_168 = auVar26._0_8_ * auVar32._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar14 * dVar12 * 0.5;
    auVar27 = vfnmadd231sd_avx512f(auVar45,auVar32,auVar27);
    local_1e0 = auVar27._0_8_;
    auVar27 = vmulsd_avx512f(local_58,auVar34);
    auVar26 = vmulsd_avx512f(local_68,auVar34);
    dStack_158 = auVar27._0_8_ * auVar32._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar11 * dVar12 * 0.5;
    auVar27 = vsubsd_avx512f(auVar46,auVar70);
    local_1d8 = auVar27._0_8_;
    auVar47._0_8_ = auVar23._0_8_ + auVar23._0_8_;
    auVar47._8_8_ = auVar23._8_8_ + auVar23._8_8_;
    auVar27 = vhsubpd_avx(auVar47,auVar47);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar31 * dVar10 * 0.5;
    auVar23 = vfmadd231sd_fma(auVar59,auVar26,auVar32);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar12 * dVar9 * 0.5;
    auVar26 = vfnmadd231sd_fma(auVar69,auVar26,auVar32);
    dVar31 = this->s3;
    auVar33._0_8_ = auVar27._0_8_;
    local_180 = dVar48 * dVar9 * 0.5 - dVar31;
    local_178 = -dStack_168 - dVar48 * auVar33._0_8_ * 0.5;
    uStack_170 = auVar23._0_8_;
    dStack_168 = dStack_168 + dVar8 * dVar9 * 0.5;
    dStack_148 = dStack_158 + auVar33._0_8_ * auVar28._0_8_ * 0.5;
    dStack_158 = dVar52 * dVar10 * 0.5 - dStack_158;
    uStack_150 = auVar26._0_8_;
    auVar33._0_8_ = dVar52 * auVar33._0_8_ * 0.5 - dVar31;
    dStack_140 = -dVar31 - dVar12 * dVar10 * 0.5;
  }
  else {
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    local_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    local_1f0 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
    local_178 = 0.0;
    uStack_170 = 0;
    dStack_168 = 0.0;
    dStack_158 = 0.0;
    uStack_150 = 0;
    dStack_148 = 0.0;
    auVar39._0_8_ = -dVar31;
    auVar39._8_8_ = 0x8000000000000000;
    auVar35._0_8_ = -this->s2;
    auVar35._8_8_ = 0x8000000000000000;
    auVar33._0_8_ = -this->s3;
    auVar33._8_8_ = 0x8000000000000000;
    local_1d0 = vmovlpd_avx(auVar39);
    uStack_1b0 = vmovlpd_avx(auVar39);
    local_218 = vmovlpd_avx(auVar35);
    uStack_1f8 = vmovlpd_avx(auVar35);
    local_1d8 = vmovlpd_avx(auVar35);
    local_190 = vmovlpd_avx(auVar39);
    local_180 = (double)vmovlpd_avx(auVar33);
    dStack_140 = auVar33._0_8_;
  }
  pCVar1 = &(this->constraint1).tuple_a.Cq;
  uVar19 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  dStack_160 = auVar33._0_8_;
  if ((uVar19 == 0) || (memcpy(pCVar1,&local_120,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_a.Cq.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&local_120 + uVar18),0x18 - uVar18);
  }
  pCVar1 = &(this->constraint2).tuple_a.Cq;
  uVar19 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar1,&local_108,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_a.Cq.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&local_108 + uVar18),0x18 - uVar18);
  }
  pCVar1 = &(this->constraint3).tuple_a.Cq;
  uVar19 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar1,&uStack_f0,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_a.Cq.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&uStack_f0 + uVar18),0x18 - uVar18);
  }
  pCVar2 = &(this->constraint1).tuple_b.Cq_1;
  uVar19 = -((uint)((ulong)pCVar2 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar2,&local_1d0,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_b.Cq_1.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&local_1d0 + uVar18),0x18 - uVar18);
  }
  pCVar2 = &(this->constraint2).tuple_b.Cq_1;
  uVar19 = -((uint)((ulong)pCVar2 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar2,&uStack_1b8,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_b.Cq_1.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&uStack_1b8 + uVar18),0x18 - uVar18)
    ;
  }
  pCVar2 = &(this->constraint3).tuple_b.Cq_1;
  uVar19 = -((uint)((ulong)pCVar2 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar2,&uStack_1a0,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_b.Cq_1.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&uStack_1a0 + uVar18),0x18 - uVar18)
    ;
  }
  pCVar3 = &(this->constraint1).tuple_b.Cq_2;
  uVar19 = -((uint)((ulong)pCVar3 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar3,&local_218,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_b.Cq_2.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&local_218 + uVar18),0x18 - uVar18);
  }
  pCVar3 = &(this->constraint2).tuple_b.Cq_2;
  uVar19 = -((uint)((ulong)pCVar3 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar3,&uStack_200,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_b.Cq_2.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&uStack_200 + uVar18),0x18 - uVar18)
    ;
  }
  pCVar3 = &(this->constraint3).tuple_b.Cq_2;
  uVar19 = -((uint)((ulong)pCVar3 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar3,&local_1e8,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_b.Cq_2.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&local_1e8 + uVar18),0x18 - uVar18);
  }
  pCVar4 = &(this->constraint1).tuple_b.Cq_3;
  uVar19 = -((uint)((ulong)pCVar4 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar4,&local_180,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_b.Cq_3.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&local_180 + uVar18),0x18 - uVar18);
  }
  pCVar4 = &(this->constraint2).tuple_b.Cq_3;
  uVar19 = -((uint)((ulong)pCVar4 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 == 0) || (memcpy(pCVar4,&dStack_168,(ulong)(uVar17 * 8)), uVar19 < 3)) {
    uVar18 = (ulong)(uVar17 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_b.Cq_3.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar18),(void *)((long)&dStack_168 + uVar18),0x18 - uVar18)
    ;
  }
  pCVar4 = &(this->constraint3).tuple_b.Cq_3;
  uVar19 = -((uint)((ulong)pCVar4 >> 3) & 0x1fffffff) & 7;
  uVar17 = 3;
  if (uVar19 < 3) {
    uVar17 = uVar19;
  }
  if ((uVar19 != 0) && (memcpy(pCVar4,&uStack_150,(ulong)(uVar17 * 8)), 2 < uVar19)) {
    return;
  }
  uVar18 = (ulong)(uVar17 << 3);
  memcpy((void *)((long)(this->constraint3).tuple_b.Cq_3.
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                        m_data.array + uVar18),(void *)((long)&uStack_150 + uVar18),0x18 - uVar18);
  return;
}

Assistant:

void ChLinkPointTriface::ConstraintsLoadJacobians() {
    double s1 = 1 - s2 - s3;

    // compute jacobians
    ChMatrix33<> Jxa;
    Jxa.setIdentity();

    ChMatrix33<> Jxb1;
    ChMatrix33<> Jxb2;
    ChMatrix33<> Jxb3;

    if (d != 0) {
        double t2 = mtriangle.mnodeB1->pos.x() - mtriangle.mnodeB2->pos.x();
        double t3 = mtriangle.mnodeB1->pos.y() - mtriangle.mnodeB3->pos.y();
        double t4 = t2 * t3;
        double t5 = mtriangle.mnodeB1->pos.y() - mtriangle.mnodeB2->pos.y();
        double t6 = mtriangle.mnodeB1->pos.x() - mtriangle.mnodeB3->pos.x();
        double t12 = t5 * t6;
        double t7 = t4 - t12;
        double t8 = mtriangle.mnodeB1->pos.z() - mtriangle.mnodeB3->pos.z();
        double t9 = t2 * t8;
        double t10 = mtriangle.mnodeB1->pos.z() - mtriangle.mnodeB2->pos.z();
        double t14 = t6 * t10;
        double t11 = t9 - t14;
        double t13 = std::abs(t7);
        double t15 = std::abs(t11);
        double t16 = t5 * t8;
        double t22 = t3 * t10;
        double t17 = t16 - t22;
        double t18 = std::abs(t17);
        double t19 = mtriangle.mnodeB2->pos.z() - mtriangle.mnodeB3->pos.z();
        double t20 = std::pow(t13, 2);
        double t21 = std::pow(t15, 2);
        double t23 = std::pow(t18, 2);
        double t24 = t20 + t21 + t23;
        double t25 = mysgn(t7);
        double t26 = 1.0 / std::pow(t24, (3.0 / 2.0));
        double t27 = mtriangle.mnodeB2->pos.y() - mtriangle.mnodeB3->pos.y();
        double t28 = 1.0 / sqrt(t24);
        double t29 = mysgn(t11);
        double t30 = mtriangle.mnodeB2->pos.x() - mtriangle.mnodeB3->pos.x();
        double t31 = mysgn(t17);
        double t32 = d * t19 * t28;
        double t33 = t13 * t25 * t27 * 2.0;
        double t34 = t15 * t19 * t29 * 2.0;
        double t35 = t33 + t34;
        double t36 = t13 * t25 * t30 * 2.0;
        double t59 = t18 * t19 * t31 * 2.0;
        double t37 = t36 - t59;
        double t38 = t15 * t29 * t30 * 2.0;
        double t39 = t18 * t27 * t31 * 2.0;
        double t40 = t38 + t39;
        double t41 = t3 * t13 * t25 * 2.0;
        double t42 = t8 * t15 * t29 * 2.0;
        double t43 = t41 + t42;
        double t44 = t6 * t13 * t25 * 2.0;
        double t61 = t8 * t18 * t31 * 2.0;
        double t45 = t44 - t61;
        double t46 = t6 * t15 * t29 * 2.0;
        double t47 = t3 * t18 * t31 * 2.0;
        double t48 = t46 + t47;
        double t49 = d * t10 * t28;
        double t50 = t5 * t13 * t25 * 2.0;
        double t51 = t10 * t15 * t29 * 2.0;
        double t52 = t50 + t51;
        double t53 = t2 * t13 * t25 * 2.0;
        double t63 = t10 * t18 * t31 * 2.0;
        double t54 = t53 - t63;
        double t55 = t2 * t15 * t29 * 2.0;
        double t56 = t5 * t18 * t31 * 2.0;
        double t57 = t55 + t56;
        double t58 = d * t28 * t30;
        double t60 = d * t3 * t28;
        double t62 = d * t2 * t28;

        Jxb1(0, 0) = -s1 + (d * t17 * t26 * t35) / 2;
        Jxb1(0, 1) = -t32 - (d * t17 * t26 * t37) / 2;
        Jxb1(0, 2) = -(d * t17 * t26 * t40) / 2 + d * t27 * t28;
        Jxb1(1, 0) = -(d * t11 * t26 * t35) / 2 + t32;
        Jxb1(1, 1) = -s1 + (d * t11 * t26 * t37) / 2;
        Jxb1(1, 2) = -t58 + (d * t11 * t26 * t40) / 2;
        Jxb1(2, 0) = -d * t27 * t28 + (d * t7 * t26 * t35) / 2;
        Jxb1(2, 1) = -(d * t7 * t26 * t37) / 2 + t58;
        Jxb1(2, 2) = -s1 - (d * t7 * t26 * t40) / 2;

        Jxb2(0, 0) = -s2 - (d * t17 * t26 * t43) / 2;
        Jxb2(0, 1) = d * t8 * t28 + (d * t17 * t26 * t45) / 2;
        Jxb2(0, 2) = -t60 + (d * t17 * t26 * t48) / 2;
        Jxb2(1, 0) = -d * t8 * t28 + (d * t11 * t26 * t43) / 2, Jxb2(1, 1) = -s2 - (d * t11 * t26 * t45) / 2;
        Jxb2(1, 2) = -(d * t11 * t26 * t48) / 2 + d * t6 * t28;
        Jxb2(2, 0) = -(d * t7 * t26 * t43) / 2 + t60;
        Jxb2(2, 1) = -d * t6 * t28 + (d * t7 * t26 * t45) / 2;
        Jxb2(2, 2) = -s2 + (d * t7 * t26 * t48) / 2;

        Jxb3(0, 0) = -s3 + (d * t17 * t26 * t52) / 2;
        Jxb3(0, 1) = -t49 - (d * t17 * t26 * t54) / 2;
        Jxb3(0, 2) = -(d * t17 * t26 * t57) / 2 + d * t5 * t28;
        Jxb3(1, 0) = -(d * t11 * t26 * t52) / 2 + t49;
        Jxb3(1, 1) = -s3 + (d * t11 * t26 * t54) / 2;
        Jxb3(1, 2) = -t62 + (d * t11 * t26 * t57) / 2;
        Jxb3(2, 0) = -d * t5 * t28 + (d * t7 * t26 * t52) / 2;
        Jxb3(2, 1) = -(d * t7 * t26 * t54) / 2 + t62;
        Jxb3(2, 2) = -s3 - (d * t7 * t26 * t57) / 2;
    } else {
        // simplified jacobian when offset d = 0;
        Jxb1.setZero();
        Jxb2.setZero();
        Jxb3.setZero();
        Jxb1.fillDiagonal(-s1);
        Jxb2.fillDiagonal(-s2);
        Jxb3.fillDiagonal(-s3);
    }

    constraint1.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(0);
    constraint2.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(1);
    constraint3.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(2);

    constraint1.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(0);
    constraint2.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(1);
    constraint3.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(2);

    constraint1.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(0);
    constraint2.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(1);
    constraint3.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(2);

    constraint1.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(0);
    constraint2.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(1);
    constraint3.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(2);
}